

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O1

ssize_t C_std::Write(int fd,void *buf,size_t count)

{
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  ssize_t unaff_R12;
  string local_50;
  
  do {
    sVar2 = write(fd,buf,count);
    if ((int)sVar2 < 0) {
      piVar3 = __errno_location();
      bVar1 = true;
      if ((*piVar3 != 4) && (*piVar3 != 0xb)) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"write error","");
        perror_exit(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00103ec9;
      }
    }
    else {
LAB_00103ec9:
      unaff_R12 = (ssize_t)(int)sVar2;
      bVar1 = false;
    }
    if (!bVar1) {
      return unaff_R12;
    }
  } while( true );
}

Assistant:

ssize_t Write(int fd, const void *buf, size_t count) {
        AGAIN:
        int n = write(fd, buf, count);
        if (n < 0) {
            //出错处理
            if (errno == EAGAIN || errno == EWOULDBLOCK) {
                goto AGAIN;
            } else if (errno == EINTR) {
                //慢速系统调用，如果被注册捕捉函数的信号中断则重新读取
                goto AGAIN;
            } else {
                perror_exit("write error");
            }
        }
        return n;
    }